

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001ac410 = 0x2d2d2d2d2d2d2d;
    uRam00000000001ac417._0_1_ = '-';
    uRam00000000001ac417._1_1_ = '-';
    uRam00000000001ac417._2_1_ = '-';
    uRam00000000001ac417._3_1_ = '-';
    uRam00000000001ac417._4_1_ = '-';
    uRam00000000001ac417._5_1_ = '-';
    uRam00000000001ac417._6_1_ = '-';
    uRam00000000001ac417._7_1_ = '-';
    DAT_001ac400 = '-';
    DAT_001ac400_1._0_1_ = '-';
    DAT_001ac400_1._1_1_ = '-';
    DAT_001ac400_1._2_1_ = '-';
    DAT_001ac400_1._3_1_ = '-';
    DAT_001ac400_1._4_1_ = '-';
    DAT_001ac400_1._5_1_ = '-';
    DAT_001ac400_1._6_1_ = '-';
    uRam00000000001ac408 = 0x2d2d2d2d2d2d2d;
    DAT_001ac40f = 0x2d;
    DAT_001ac3f0 = '-';
    DAT_001ac3f0_1._0_1_ = '-';
    DAT_001ac3f0_1._1_1_ = '-';
    DAT_001ac3f0_1._2_1_ = '-';
    DAT_001ac3f0_1._3_1_ = '-';
    DAT_001ac3f0_1._4_1_ = '-';
    DAT_001ac3f0_1._5_1_ = '-';
    DAT_001ac3f0_1._6_1_ = '-';
    uRam00000000001ac3f8._0_1_ = '-';
    uRam00000000001ac3f8._1_1_ = '-';
    uRam00000000001ac3f8._2_1_ = '-';
    uRam00000000001ac3f8._3_1_ = '-';
    uRam00000000001ac3f8._4_1_ = '-';
    uRam00000000001ac3f8._5_1_ = '-';
    uRam00000000001ac3f8._6_1_ = '-';
    uRam00000000001ac3f8._7_1_ = '-';
    DAT_001ac3e0 = '-';
    DAT_001ac3e0_1._0_1_ = '-';
    DAT_001ac3e0_1._1_1_ = '-';
    DAT_001ac3e0_1._2_1_ = '-';
    DAT_001ac3e0_1._3_1_ = '-';
    DAT_001ac3e0_1._4_1_ = '-';
    DAT_001ac3e0_1._5_1_ = '-';
    DAT_001ac3e0_1._6_1_ = '-';
    uRam00000000001ac3e8._0_1_ = '-';
    uRam00000000001ac3e8._1_1_ = '-';
    uRam00000000001ac3e8._2_1_ = '-';
    uRam00000000001ac3e8._3_1_ = '-';
    uRam00000000001ac3e8._4_1_ = '-';
    uRam00000000001ac3e8._5_1_ = '-';
    uRam00000000001ac3e8._6_1_ = '-';
    uRam00000000001ac3e8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001ac3d8._0_1_ = '-';
    uRam00000000001ac3d8._1_1_ = '-';
    uRam00000000001ac3d8._2_1_ = '-';
    uRam00000000001ac3d8._3_1_ = '-';
    uRam00000000001ac3d8._4_1_ = '-';
    uRam00000000001ac3d8._5_1_ = '-';
    uRam00000000001ac3d8._6_1_ = '-';
    uRam00000000001ac3d8._7_1_ = '-';
    DAT_001ac41f = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}